

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugDirWrapper.cpp
# Opt level: O2

bool __thiscall DebugDirWrapper::isRepro(DebugDirWrapper *this)

{
  pointer ppEVar1;
  long *plVar2;
  pointer ppEVar3;
  bool isOk;
  
  for (ppEVar3 = (this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries.
                 super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppEVar1 = *(pointer *)
                 ((long)&(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
                         entries.
                         super__Vector_base<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>.
                         _M_impl.super__Vector_impl_data + 8), ppEVar3 != ppEVar1;
      ppEVar3 = ppEVar3 + 1) {
    if ((*ppEVar3 != (ExeNodeWrapper *)0x0) &&
       (plVar2 = (long *)__dynamic_cast(*ppEVar3,&ExeNodeWrapper::typeinfo,
                                        &DebugDirEntryWrapper::typeinfo,0), plVar2 != (long *)0x0))
    {
      (**(code **)(*plVar2 + 0xe0))(plVar2,4,0xffffffffffffffff);
    }
  }
  return ppEVar3 != ppEVar1;
}

Assistant:

bool DebugDirWrapper::isRepro()
{
    for (auto itr = entries.begin(); itr != entries.end(); ++itr) {
        DebugDirEntryWrapper* dbgEntry = dynamic_cast<DebugDirEntryWrapper*>(*itr);
        if (!dbgEntry) continue;
        
        bool isOk = false;
        uint64_t typeVal = dbgEntry->getNumValue(DebugDirEntryWrapper::TYPE, &isOk);
        if (isOk && typeVal == pe::DT_REPRO) {
            return true;
        }
    }
    return false;
}